

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemTable.cpp
# Opt level: O2

int __thiscall MemTable::remove(MemTable *this,char *__filename)

{
  size_t sVar1;
  size_t sVar2;
  QuadListNode<SSTableDataEntry> *pred_node;
  Result RVar3;
  allocator<char> local_51;
  string local_50;
  
  RVar3 = skipSearch(this,(this->qlist).
                          super__List_base<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>
                          ._M_impl._M_node.super__List_node_base._M_next,(longlong)__filename);
  pred_node = RVar3.node;
  sVar1 = time((time_t *)0x0);
  sVar2 = sVar1;
  if (((undefined1  [16])RVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_51);
    _put(this,pred_node,(longlong)__filename,&local_50,true);
    sVar2 = std::__cxx11::string::~string((string *)&local_50);
  }
  if ((char *)(pred_node->data).key == __filename) {
    if ((pred_node->data).delete_flag == false) {
      this->_size_bytes = (this->_size_bytes - (pred_node->data).value._M_string_length) - 0x19;
      std::__cxx11::string::assign((char *)&(pred_node->data).value);
      (pred_node->data).timestamp = sVar1;
      (pred_node->data).value_length = 0;
      sVar2 = (pred_node->data).value._M_string_length + this->_size_bytes + 0x19;
      this->_size_bytes = sVar2;
      do {
        (pred_node->data).delete_flag = true;
        pred_node = pred_node->above;
      } while (pred_node != (QuadListNode<SSTableDataEntry> *)0x0);
    }
    else {
      (pred_node->data).timestamp = sVar1;
    }
  }
  return (int)CONCAT71((int7)(sVar2 >> 8),1);
}

Assistant:

bool MemTable::remove(long long k) {
    auto[valid, to_delete] = skipSearch(qlist.begin(), k);
    auto timestamp = time(nullptr);
    if (!valid) {
        // k not found, as MemTable of a LSMTree, insert new tower marked as deleted.
        _put(to_delete, k, "", true);
    }
    if (to_delete->data.key == k && !to_delete->data.delete_flag) {
        // found k and has not been marked as deleted. mark deleted, remove value, update timestamp.
        _size_bytes -= size_of_node(to_delete);
        to_delete->data.value = "";
        to_delete->data.timestamp = timestamp;
        to_delete->data.value_length = 0;
        _size_bytes += size_of_node(to_delete);
        do {
            to_delete->data.delete_flag = true;
            to_delete = to_delete->above;
        } while (to_delete != nullptr);
        return true;
    }
    if (to_delete->data.key == k && to_delete->data.delete_flag) {
        // found k and its has been marked as deleted, just update timestamp.
        to_delete->data.timestamp = timestamp; // bytes level size don't change.
    }
    return true;
}